

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.hpp
# Opt level: O0

void __thiscall
xs::SimpleMessage<102>::SimpleMessage(SimpleMessage<102> *this,deUint8 *data,size_t dataSize)

{
  deBool dVar1;
  Error *this_00;
  size_t dataSize_local;
  deUint8 *data_local;
  SimpleMessage<102> *this_local;
  
  Message::Message(&this->super_Message,MESSAGETYPE_KEEPALIVE);
  (this->super_Message)._vptr_Message = (_func_int **)&PTR__SimpleMessage_0015f4a8;
  do {
    dVar1 = deGetFalse();
    if (dVar1 != 0 || dataSize != 0) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"No payload expected","dataSize == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.hpp"
                   ,0x5c);
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  return;
}

Assistant:

SimpleMessage	(const deUint8* data, size_t dataSize) : Message((MessageType)MsgType) { DE_UNREF(data); XS_CHECK_MSG(dataSize == 0, "No payload expected"); }